

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TypeEntry::~TypeEntry(TypeEntry *this)

{
  ~TypeEntry(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~TypeEntry() = default;